

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O2

int run_benchmark_ping_pongs(void)

{
  uv_tcp_t *tcp;
  int iVar1;
  undefined8 *puVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  sockaddr_in client_addr;
  sockaddr_in local_30;
  sockaddr_in local_20;
  
  loop = uv_default_loop();
  start_time = uv_now(loop);
  iVar1 = uv_ip4_addr("0.0.0.0",0,&local_20);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_30);
    if (iVar1 == 0) {
      puVar2 = (undefined8 *)malloc(0x1b0);
      *puVar2 = 0;
      tcp = (uv_tcp_t *)(puVar2 + 1);
      iVar1 = uv_tcp_init(loop,tcp);
      if (iVar1 == 0) {
        puVar2[1] = puVar2;
        iVar1 = uv_tcp_bind(tcp,(sockaddr *)&local_20,0);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_connect((uv_connect_t *)(puVar2 + 0x20),tcp,(sockaddr *)&local_30,
                                 pinger_connect_cb);
          if (iVar1 == 0) {
            uv_run(loop,UV_RUN_DEFAULT);
            if (completed_pingers == 1) {
              puVar3 = uv_default_loop();
              uv_walk(puVar3,close_walk_cb,(void *)0x0);
              uv_run(puVar3,UV_RUN_DEFAULT);
              puVar3 = uv_default_loop();
              iVar1 = uv_loop_close(puVar3);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar5 = "0 == uv_loop_close(uv_default_loop())";
              uVar4 = 0xdb;
            }
            else {
              pcVar5 = "completed_pingers == 1";
              uVar4 = 0xd9;
            }
          }
          else {
            pcVar5 = "!r";
            uVar4 = 0xcd;
          }
        }
        else {
          pcVar5 = "0 == uv_tcp_bind(&pinger->tcp, (const struct sockaddr*) &client_addr, 0)";
          uVar4 = 199;
        }
      }
      else {
        pcVar5 = "!r";
        uVar4 = 0xc1;
      }
    }
    else {
      pcVar5 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)";
      uVar4 = 0xba;
    }
  }
  else {
    pcVar5 = "0 == uv_ip4_addr(\"0.0.0.0\", 0, &client_addr)";
    uVar4 = 0xb9;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-pongs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

BENCHMARK_IMPL(ping_pongs) {
  loop = uv_default_loop();

  start_time = uv_now(loop);

  pinger_new();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(completed_pingers == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}